

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * randomMessageGen_abi_cxx11_(void)

{
  uint uVar1;
  result_type rVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  string *in_RDI;
  uniform_int_distribution<int> dis;
  mt19937 gen;
  random_device rd;
  param_type local_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2720;
  random_device local_1398;
  
  std::random_device::random_device(&local_1398);
  uVar1 = std::random_device::_M_getval();
  local_2720._M_x[0] = (unsigned_long)uVar1;
  lVar4 = 1;
  uVar3 = local_2720._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
    local_2720._M_x[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_2720._M_p = 0x270;
  local_2728._M_a = 1;
  local_2728._M_b = 8;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_2728,&local_2720,&local_2728);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  switch(rVar2) {
  case 1:
    std::__cxx11::string::_M_construct<char_const*>();
    break;
  case 2:
    std::__cxx11::string::_M_construct<char_const*>();
    break;
  case 3:
    std::__cxx11::string::_M_construct<char_const*>();
    break;
  case 4:
    std::__cxx11::string::_M_construct<char_const*>();
    break;
  case 5:
    std::__cxx11::string::_M_construct<char_const*>();
    break;
  case 6:
    std::__cxx11::string::_M_construct<char_const*>();
    break;
  case 7:
    std::__cxx11::string::_M_construct<char_const*>();
    break;
  default:
    std::__cxx11::string::_M_construct<char_const*>();
  }
  std::random_device::_M_fini();
  return in_RDI;
}

Assistant:

string randomMessageGen()
{
    random_device rd;
    mt19937 gen(rd());
    const int AVALIVABLE_MSG = 8;
    uniform_int_distribution<> dis(1, AVALIVABLE_MSG);
    switch (dis(gen)) {
      case 1:
         return "Riddikulus";
      case 2:
          return "Crucio";
      case 3:
          return "Lumos";
      case 4:
          return "Nox";
      case 5:
          return "Patronus";
      case 6:
         return "Imperio";
      case 7:
        return "Expelliarmus";
      default:
         return "Pulvis et umbra sumus";
    }
}